

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaVector<char,_VmaStlAllocator<char>_>::resize
          (VmaVector<char,_VmaStlAllocator<char>_> *this,size_t newCount)

{
  VkAllocationCallbacks *pVVar1;
  char *__dest;
  ulong uVar2;
  ulong size;
  
  if (this->m_Capacity < newCount) {
    uVar2 = this->m_Capacity * 3;
    size = 8;
    if (0xf < uVar2) {
      size = uVar2 >> 1;
    }
    if (size <= newCount) {
      size = newCount;
    }
    __dest = (char *)VmaMalloc((this->m_Allocator).m_pCallbacks,size,1);
    uVar2 = this->m_Count;
    if (uVar2 != 0) {
      if (newCount <= uVar2) {
        uVar2 = newCount;
      }
      memcpy(__dest,this->m_pArray,uVar2);
    }
    pVVar1 = (this->m_Allocator).m_pCallbacks;
    if ((pVVar1 == (VkAllocationCallbacks *)0x0) || (pVVar1->pfnFree == (PFN_vkFreeFunction)0x0)) {
      free(this->m_pArray);
    }
    else {
      (*pVVar1->pfnFree)(pVVar1->pUserData,this->m_pArray);
    }
    this->m_Capacity = size;
    this->m_pArray = __dest;
  }
  this->m_Count = newCount;
  return;
}

Assistant:

void VmaVector<T, AllocatorT>::resize(size_t newCount)
{
    size_t newCapacity = m_Capacity;
    if (newCount > m_Capacity)
    {
        newCapacity = VMA_MAX(newCount, VMA_MAX(m_Capacity * 3 / 2, (size_t)8));
    }

    if (newCapacity != m_Capacity)
    {
        T* const newArray = newCapacity ? VmaAllocateArray<T>(m_Allocator.m_pCallbacks, newCapacity) : VMA_NULL;
        const size_t elementsToCopy = VMA_MIN(m_Count, newCount);
        if (elementsToCopy != 0)
        {
            memcpy(newArray, m_pArray, elementsToCopy * sizeof(T));
        }
        VmaFree(m_Allocator.m_pCallbacks, m_pArray);
        m_Capacity = newCapacity;
        m_pArray = newArray;
    }

    m_Count = newCount;
}